

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O0

string * __thiscall pbrt::MIPMapFilterOptions::ToString_abi_cxx11_(MIPMapFilterOptions *this)

{
  string *in_RDI;
  FilterFunction *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::FilterFunction_const&,float_const&>
            (in_stack_00000018,in_stack_00000010,(float *)this);
  return in_RDI;
}

Assistant:

std::string MIPMapFilterOptions::ToString() const {
    return StringPrintf("[ MIPMapFilterOptions filter: %s maxAnisotropy: %f ]", filter,
                        maxAnisotropy);
}